

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O3

CURLcode canon_query(Curl_easy *data,char *query,dynbuf *dq)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  char *p;
  uint uVar6;
  size_t *psVar7;
  bool bVar8;
  _Bool found_equals;
  pair array [64];
  _Bool local_439;
  size_t local_438 [129];
  
  if (query == (char *)0x0) {
    return CURLE_OK;
  }
  psVar7 = local_438 + 1;
  lVar5 = 0;
  do {
    psVar7[-1] = (size_t)query;
    pcVar2 = strchr(query,0x26);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(query);
      *psVar7 = sVar3;
      uVar4 = (uint)lVar5;
      if (uVar4 != 0x3f) {
        psVar7 = local_438;
        qsort(psVar7,lVar5 + 1,0x10,compare_func);
        uVar6 = 0;
        do {
          local_439 = false;
          CVar1 = CURLE_OK;
          if (psVar7[1] != 0) {
            CVar1 = canon_string((char *)*psVar7,psVar7[1],dq,&local_439);
            if (CVar1 != CURLE_OK) {
              return CVar1;
            }
            if ((local_439 == false) && (CVar1 = Curl_dyn_addn(dq,"=",1), CVar1 != CURLE_OK)) {
              return CVar1;
            }
            CVar1 = CURLE_OK;
            if (uVar6 < uVar4) {
              CVar1 = Curl_dyn_addn(dq,"&",1);
            }
          }
          if (CVar1 != CURLE_OK) {
            return CVar1;
          }
          psVar7 = psVar7 + 2;
          bVar8 = uVar6 < uVar4;
          uVar6 = uVar6 + 1;
        } while (bVar8);
        return CURLE_OK;
      }
      break;
    }
    *psVar7 = (long)pcVar2 - (long)query;
    query = pcVar2 + 1;
    lVar5 = lVar5 + 1;
    psVar7 = psVar7 + 2;
  } while ((int)lVar5 != 0x40);
  Curl_failf(data,"aws-sigv4: too many query pairs in URL");
  return CURLE_URL_MALFORMAT;
}

Assistant:

static CURLcode canon_query(struct Curl_easy *data,
                            const char *query, struct dynbuf *dq)
{
  CURLcode result = CURLE_OK;
  int entry = 0;
  int i;
  const char *p = query;
  struct pair array[MAX_QUERYPAIRS];
  struct pair *ap = &array[0];
  if(!query)
    return result;

  /* sort the name=value pairs first */
  do {
    char *amp;
    entry++;
    ap->p = p;
    amp = strchr(p, '&');
    if(amp)
      ap->len = amp - p; /* excluding the ampersand */
    else {
      ap->len = strlen(p);
      break;
    }
    ap++;
    p = amp + 1;
  } while(entry < MAX_QUERYPAIRS);
  if(entry == MAX_QUERYPAIRS) {
    /* too many query pairs for us */
    failf(data, "aws-sigv4: too many query pairs in URL");
    return CURLE_URL_MALFORMAT;
  }

  qsort(&array[0], entry, sizeof(struct pair), compare_func);

  ap = &array[0];
  for(i = 0; !result && (i < entry); i++, ap++) {
    const char *q = ap->p;
    bool found_equals = FALSE;
    if(!ap->len)
      continue;
    result = canon_string(q, ap->len, dq, &found_equals);
    if(!result && !found_equals) {
      /* queries without value still need an equals */
      result = Curl_dyn_addn(dq, "=", 1);
    }
    if(!result && i < entry - 1) {
      /* insert ampersands between query pairs */
      result = Curl_dyn_addn(dq, "&", 1);
    }
  }
  return result;
}